

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O3

void __thiscall
Wasm::WasmBinaryReader::ReadTableSection(WasmBinaryReader *this,bool isImportSection)

{
  code *pcVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  uint sourceContextId;
  undefined4 *puVar5;
  FunctionInfo *pFVar6;
  uint32 maxInitial;
  undefined7 in_register_00000031;
  WasmBinaryReader *pWVar7;
  FunctionBody *pFVar8;
  SectionLimits local_30;
  uint32 local_24 [2];
  uint32 length;
  
  if ((int)CONCAT71(in_register_00000031,isImportSection) == 0) {
    pWVar7 = this;
    uVar4 = LEB128<unsigned_int,32u>(this,local_24);
    if (1 < uVar4) {
      ThrowDecodingError(pWVar7,L"Maximum of one table allowed");
    }
    if (uVar4 != 1) {
      return;
    }
  }
  pWVar7 = this;
  cVar2 = LEB128<char,7u>(this,local_24);
  if (cVar2 != -0x10) {
    ThrowDecodingError(pWVar7,L"Only anyfunc type is supported. Unknown type %d",
                       (ulong)(uint)(int)cVar2);
  }
  maxInitial = 0xffffffff;
  if (DAT_015932e2 == '\0') {
    maxInitial = DAT_015932e8;
  }
  local_30 = (SectionLimits)
             ReadSectionLimitsBase<Wasm::TableSectionLimits>
                       (this,maxInitial,maxInitial,L"table too big");
  Js::WebAssemblyModule::InitializeTable(this->m_module,(TableSectionLimits *)&local_30);
  pFVar8 = (this->m_funcState).body;
  if (pFVar8 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,WasmReaderPhase);
  }
  else {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar8);
    if (this->m_readerState == READER_STATE_FUNCTION) {
      pFVar8 = (this->m_funcState).body;
    }
    else {
      pFVar8 = (FunctionBody *)0x0;
    }
    pFVar6 = (pFVar8->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar6 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
      pFVar6 = (pFVar8->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar3 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015b6718,WasmReaderPhase,sourceContextId,pFVar6->functionId);
  }
  if (bVar3 != false) {
    Output::Print(L"Indirect table: %u to %u entries",(ulong)local_30.initial,
                  (ulong)local_30.maximum);
    Output::Print(L"\n");
    Output::Flush();
  }
  return;
}

Assistant:

void WasmBinaryReader::ReadTableSection(bool isImportSection)
{
    uint32 length;
    uint32 entries;
    if (isImportSection)
    {
        entries = 1;
    }
    else
    {
        entries = LEB128(length);
    }
    if (entries > 1)
    {
        ThrowDecodingError(_u("Maximum of one table allowed"));
    }

    if (entries == 1)
    {
        int8 elementType = SLEB128<int8, 7>(length);
        if (elementType != LanguageTypes::anyfunc)
        {
            ThrowDecodingError(_u("Only anyfunc type is supported. Unknown type %d"), elementType);
        }
        TableSectionLimits limits = ReadSectionLimitsBase<TableSectionLimits>(Limits::GetMaxTableSize(), Limits::GetMaxTableSize(), _u("table too big"));
        m_module->InitializeTable(&limits);
        TRACE_WASM_DECODER(_u("Indirect table: %u to %u entries"), limits.initial, limits.maximum);
    }
}